

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_norm_infinity(Integer g_a,double *nm)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  float *pfVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  char *string;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  float fVar18;
  long lVar19;
  double dVar20;
  double *pdVar21;
  long lVar22;
  bool bVar23;
  uint uVar24;
  ulong uVar25;
  float fVar26;
  double dVar27;
  float fVar28;
  double dVar29;
  float fsum;
  int isum;
  Integer type;
  char *ptr;
  double dsum;
  long lsum;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  float fval;
  Integer ndim;
  Integer dims [7];
  _iterator_hdl hdl;
  undefined1 local_3f8 [8];
  double *local_3f0;
  long local_3e8;
  double local_3e0;
  Integer local_3d8;
  float local_3d0 [2];
  double *local_3c8;
  double local_3c0;
  double local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  double *local_380;
  undefined8 local_378;
  long local_370;
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_3f0 = nm;
  pnga_nodeid();
  pnga_nnodes();
  iVar2 = _ga_sync_end;
  local_3f8._4_4_ = 0;
  local_3b8 = 0.0;
  local_3c0 = 0.0;
  local_3f8._0_4_ = 0.0;
  local_3c8 = (double *)0x0;
  local_3e0 = 0.0;
  local_3d0[0] = 0.0;
  _ga_sync_end = 1;
  bVar23 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  if (bVar23) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_norm_infinity_");
  pnga_inquire(g_a,&local_3d8,&local_370,local_368);
  if (local_370 - 3U < 0xfffffffffffffffe) {
    pnga_error("ga_norm_infinity: wrong dimension",local_370);
  }
  switch(local_3d8) {
  case 0x3e9:
    pdVar9 = (double *)(local_3f8 + 4);
    break;
  case 0x3ea:
    pdVar9 = &local_3b8;
    break;
  case 0x3eb:
    pdVar9 = (double *)local_3f8;
    break;
  case 0x3ec:
    pdVar9 = &local_3c0;
    break;
  default:
    pnga_error("ga_norm_infinity_: wrong data type:",local_3d8);
    pdVar9 = (double *)0x0;
    break;
  case 0x3ee:
    pdVar9 = (double *)local_3d0;
    break;
  case 0x3ef:
    pdVar9 = &local_3e0;
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar3 = pnga_local_iterator_next(&local_330,&local_398,&local_3a8,(char **)&local_3c8,&local_3b0);
  pdVar11 = pdVar9;
  lVar4 = local_3d8;
  pdVar7 = local_3c8;
  lVar1 = local_3b0;
  pdVar5 = local_380;
  lVar6 = local_370;
  while (local_380 = pdVar11, local_3d8 = lVar4, local_3c8 = pdVar7, iVar3 != 0) {
    local_3b0 = lVar1;
    local_370 = lVar6;
    switch(lVar4 + -0x3e9) {
    case 0:
      pdVar5 = pdVar9;
      break;
    case 1:
      pdVar5 = (double *)0x0;
      pdVar11 = pdVar9;
      goto LAB_0017ca27;
    case 2:
      pdVar5 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar16 = pdVar9;
      goto LAB_0017ca35;
    case 3:
      pdVar5 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = pdVar9;
      goto LAB_0017ca32;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:",lVar4);
      pdVar5 = (double *)0x0;
      break;
    case 5:
      pdVar5 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar16 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar21 = pdVar9;
      goto LAB_0017ca3b;
    case 6:
      pdVar5 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar16 = (double *)0x0;
      pdVar14 = pdVar9;
      goto LAB_0017ca38;
    }
    pdVar11 = (double *)0x0;
LAB_0017ca27:
    pdVar13 = (double *)0x0;
LAB_0017ca32:
    pdVar16 = (double *)0x0;
LAB_0017ca35:
    pdVar14 = (double *)0x0;
LAB_0017ca38:
    pdVar21 = (double *)0x0;
LAB_0017ca3b:
    pdVar10 = local_380;
    lVar15 = local_3a8;
    if (lVar6 < 1) {
LAB_0017ca58:
      string = "ga_norm_infinity: wrong dimension";
      pdVar10 = pdVar9;
LAB_0017ca62:
      pnga_error(string,lVar6);
    }
    else {
      if (lVar6 == 1) {
        lVar19 = 1;
        lVar22 = 1;
      }
      else {
        lVar19 = local_390;
        lVar22 = local_3a0;
        if (lVar6 != 2) goto LAB_0017ca58;
      }
      if (0 < lVar22 && 0 < local_3a8) {
        local_3e8 = local_398;
        switch(lVar4 + -0x3e9) {
        case 0:
          fVar26 = *(float *)pdVar7;
          fVar28 = (float)-(int)fVar26;
          if (0 < (int)fVar26) {
            fVar28 = fVar26;
          }
          *(float *)pdVar5 = fVar28;
          lVar4 = local_3e8;
          if (lVar19 <= lVar22) {
            lVar6 = lVar15 - local_3e8;
            lVar12 = 0;
            do {
              if (lVar4 <= lVar15) {
                lVar17 = 0;
                do {
                  fVar26 = *(float *)((long)pdVar7 + lVar17 * 4);
                  fVar18 = (float)-(int)fVar26;
                  if (0 < (int)fVar26) {
                    fVar18 = fVar26;
                  }
                  if ((int)fVar28 < (int)fVar18) {
                    *(float *)pdVar5 = fVar18;
                    fVar28 = fVar18;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar6 + 1 != lVar17);
              }
              lVar12 = lVar12 + 1;
              pdVar7 = (double *)((long)pdVar7 + lVar1 * 4);
            } while (lVar12 != (lVar22 - lVar19) + 1);
          }
          break;
        case 1:
          dVar27 = *pdVar7;
          dVar29 = (double)-(long)dVar27;
          if (0 < (long)dVar27) {
            dVar29 = dVar27;
          }
          *pdVar11 = dVar29;
          lVar4 = local_3e8;
          if (lVar19 <= lVar22) {
            lVar6 = lVar15 - local_3e8;
            lVar12 = 0;
            do {
              if (lVar4 <= lVar15) {
                lVar17 = 0;
                do {
                  dVar27 = pdVar7[lVar17];
                  dVar20 = (double)-(long)dVar27;
                  if (0 < (long)dVar27) {
                    dVar20 = dVar27;
                  }
                  if ((long)dVar29 < (long)dVar20) {
                    *pdVar11 = dVar20;
                    dVar29 = dVar20;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar6 + 1 != lVar17);
              }
              lVar12 = lVar12 + 1;
              pdVar7 = pdVar7 + lVar1;
            } while (lVar12 != (lVar22 - lVar19) + 1);
          }
          break;
        case 2:
          fVar26 = *(float *)pdVar7;
          *(float *)pdVar16 = fVar26;
          lVar4 = local_3e8;
          if (lVar19 <= lVar22) {
            lVar6 = lVar15 - local_3e8;
            lVar12 = 0;
            do {
              if (lVar4 <= lVar15) {
                lVar17 = 0;
                do {
                  fVar28 = *(float *)((long)pdVar7 + lVar17 * 4);
                  uVar24 = -(uint)(fVar28 < -fVar28);
                  fVar28 = (float)(~uVar24 & (uint)fVar28 | (uint)-fVar28 & uVar24);
                  if (fVar26 < fVar28) {
                    *(float *)pdVar16 = fVar28;
                    fVar26 = fVar28;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar6 + 1 != lVar17);
              }
              lVar12 = lVar12 + 1;
              pdVar7 = (double *)((long)pdVar7 + lVar1 * 4);
            } while (lVar12 != (lVar22 - lVar19) + 1);
          }
          break;
        case 3:
          dVar27 = *pdVar7;
          *pdVar13 = dVar27;
          lVar4 = lVar15 - local_3e8;
          if (local_3e8 <= lVar15) {
            lVar6 = 0;
            do {
              if (lVar19 <= lVar22) {
                pdVar9 = pdVar7;
                lVar15 = (lVar22 - lVar19) + 1;
                do {
                  dVar29 = *pdVar9;
                  dVar20 = (double)((ulong)dVar29 ^ (ulong)DAT_001fb440);
                  uVar25 = -(ulong)(dVar29 < dVar20);
                  dVar29 = (double)(~uVar25 & (ulong)dVar29 | (ulong)dVar20 & uVar25);
                  if (dVar27 < dVar29) {
                    *pdVar13 = dVar29;
                    dVar27 = dVar29;
                  }
                  pdVar9 = pdVar9 + lVar1;
                  lVar15 = lVar15 + -1;
                } while (lVar15 != 0);
              }
              pdVar7 = pdVar7 + 1;
              bVar23 = lVar6 != lVar4;
              lVar6 = lVar6 + 1;
            } while (bVar23);
          }
          break;
        default:
          string = "sgai_norm_infinity_block: wrong data type ";
          lVar6 = lVar4;
          goto LAB_0017ca62;
        case 5:
          fVar26 = SQRT(*(float *)pdVar7 * *(float *)pdVar7 +
                        *(float *)((long)pdVar7 + 4) * *(float *)((long)pdVar7 + 4));
          *(float *)pdVar21 = fVar26;
          lVar4 = local_3e8;
          if (lVar19 <= lVar22) {
            lVar6 = lVar15 - local_3e8;
            pfVar8 = (float *)((long)pdVar7 + 4);
            lVar12 = 0;
            do {
              if (lVar4 <= lVar15) {
                lVar17 = 0;
                do {
                  fVar28 = SQRT(pfVar8[lVar17 * 2 + -1] * pfVar8[lVar17 * 2 + -1] +
                                pfVar8[lVar17 * 2] * pfVar8[lVar17 * 2]);
                  if (fVar26 < fVar28) {
                    *(float *)pdVar21 = fVar28;
                    fVar26 = fVar28;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar6 + 1 != lVar17);
              }
              lVar12 = lVar12 + 1;
              pfVar8 = pfVar8 + lVar1 * 2;
            } while (lVar12 != (lVar22 - lVar19) + 1);
          }
          break;
        case 6:
          dVar27 = SQRT(*pdVar7 * *pdVar7 + pdVar7[1] * pdVar7[1]);
          *pdVar14 = dVar27;
          lVar4 = local_3e8;
          if (lVar19 <= lVar22) {
            lVar6 = lVar15 - local_3e8;
            pdVar7 = pdVar7 + 1;
            lVar12 = 0;
            do {
              pdVar9 = pdVar7;
              lVar17 = lVar6 + 1;
              if (lVar4 <= lVar15) {
                do {
                  dVar29 = SQRT(pdVar9[-1] * pdVar9[-1] + *pdVar9 * *pdVar9);
                  if (dVar27 < dVar29) {
                    *pdVar14 = dVar29;
                    dVar27 = dVar29;
                  }
                  lVar17 = lVar17 + -1;
                  pdVar9 = pdVar9 + 2;
                } while (lVar17 != 0);
              }
              lVar12 = lVar12 + 1;
              pdVar7 = pdVar7 + lVar1 * 2;
            } while (lVar12 != (lVar22 - lVar19) + 1);
          }
        }
      }
    }
    iVar3 = pnga_local_iterator_next
                      (&local_330,&local_398,&local_3a8,(char **)&local_3c8,&local_3b0);
    pdVar9 = pdVar10;
    pdVar11 = local_380;
    lVar4 = local_3d8;
    pdVar7 = local_3c8;
    lVar1 = local_3b0;
    pdVar5 = local_380;
    lVar6 = local_370;
  }
  local_380 = pdVar5;
  switch(lVar4) {
  case 0x3e9:
    armci_msg_igop((int *)(local_3f8 + 4),1,"max");
    break;
  case 0x3ea:
    armci_msg_lgop((long *)&local_3b8,1,"max");
    break;
  case 0x3eb:
    armci_msg_fgop((float *)local_3f8,1,"max");
    break;
  case 0x3ec:
    armci_msg_dgop(&local_3c0,1,"max");
    break;
  default:
    pnga_error("ga_norm_infinity_: wrong data type ",lVar4);
    break;
  case 0x3ee:
    uVar25 = (ulong)local_378 >> 0x20;
    local_378 = (double)CONCAT44((int)uVar25,local_3d0[0]);
    armci_msg_fgop((float *)&local_378,1,"max");
    local_3d0[0] = (float)local_378;
    break;
  case 0x3ef:
    local_378 = local_3e0;
    armci_msg_dgop((double *)&local_378,1,"max");
    local_3e0 = local_378;
  }
  switch(local_3d8) {
  case 0x3e9:
    dVar27 = (double)(int)local_3f8._4_4_;
    break;
  case 0x3ea:
    dVar27 = (double)(long)local_3b8;
    break;
  case 0x3eb:
    dVar27 = (double)(float)local_3f8._0_4_;
    break;
  case 0x3ec:
    dVar27 = local_3c0;
    break;
  default:
    pnga_error("ga_norm_infinity_:wrong data type.",local_3d8);
    goto LAB_0017cf54;
  case 0x3ee:
    dVar27 = (double)local_3d0[0];
    break;
  case 0x3ef:
    dVar27 = local_3e0;
  }
  *local_3f0 = dVar27;
LAB_0017cf54:
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm_infinity(Integer g_a, double *nm)
{
  Integer type;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  float fval;
  double dval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm_infinity_");

  pnga_inquire (g_a, &type, &ndim, dims);

  if(ndim<=0)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);
  else if (ndim >= 3)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);


  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif


  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "max");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "max");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "max");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "max");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "max");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "max");
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type ", type);
  }

  /*evaluate the norm infinity for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm_infinity_:wrong data type.", type);
  }

  if (local_sync_end)pnga_sync();
}